

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O2

void A_Weave(AActor *self,int xyspeed,int zspeed,double xydist,double zdist)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  DAngle angle;
  DVector2 local_58;
  TAngle<double> local_48;
  PClass *pPStack_40;
  
  bVar1 = self->WeaveIndexXY;
  bVar2 = self->WeaveIndexZ;
  if ((xyspeed != 0) && ((xydist != 0.0 || (NAN(xydist))))) {
    dVar4 = BobSin((double)(bVar1 & 0x3f));
    uVar3 = xyspeed + (uint)bVar1 & 0x3f;
    dVar5 = (self->__Pos).X;
    dVar6 = (self->__Pos).Y;
    TAngle<double>::ToVector((TAngle<double> *)&local_58,dVar4 * xydist);
    dVar4 = BobSin((double)uVar3);
    TAngle<double>::ToVector(&stack0xffffffffffffffb8,dVar4 * xydist);
    dVar5 = (dVar5 - local_58.X) + local_48.Degrees;
    dVar6 = (dVar6 - local_58.Y) + (double)pPStack_40;
    local_58.X = dVar5;
    local_58.Y = dVar6;
    if (((self->flags5).Value & 0x200000) == 0) {
      P_TryMove(self,&local_58,1,(secplane_t *)0x0);
    }
    else {
      AActor::UnlinkFromWorld(self);
      *(byte *)&(self->flags).Value = (byte)(self->flags).Value | 0x10;
      local_58.X = dVar5 - (self->__Pos).X;
      local_58.Y = dVar6 - (self->__Pos).Y;
      AActor::Vec2Offset((AActor *)&stack0xffffffffffffffb8,local_58.X,local_58.Y,SUB81(self,0));
      (self->__Pos).X = local_48.Degrees;
      (self->__Pos).Y = (double)pPStack_40;
      AActor::LinkToWorld(self,false,(sector_t *)0x0);
    }
    self->WeaveIndexXY = (BYTE)uVar3;
  }
  if ((zspeed != 0) && ((zdist != 0.0 || (NAN(zdist))))) {
    dVar5 = BobSin((double)(bVar2 & 0x3f));
    (self->__Pos).Z = (self->__Pos).Z - dVar5 * zdist;
    uVar3 = zspeed + (uint)bVar2 & 0x3f;
    dVar5 = BobSin((double)uVar3);
    (self->__Pos).Z = dVar5 * zdist + (self->__Pos).Z;
    self->WeaveIndexZ = (BYTE)uVar3;
  }
  return;
}

Assistant:

void A_Weave(AActor *self, int xyspeed, int zspeed, double xydist, double zdist)
{
	DVector2 newpos;
	int weaveXY, weaveZ;
	DAngle angle;
	double dist;

	weaveXY = self->WeaveIndexXY & 63;
	weaveZ = self->WeaveIndexZ & 63;
	angle = self->Angles.Yaw + 90;

	if (xydist != 0 && xyspeed != 0)
	{
		dist = BobSin(weaveXY) * xydist;
		newpos = self->Pos().XY() - angle.ToVector(dist);
		weaveXY = (weaveXY + xyspeed) & 63;
		dist = BobSin(weaveXY) * xydist;
		newpos += angle.ToVector(dist);
		if (!(self->flags5 & MF5_NOINTERACTION))
		{
			P_TryMove (self, newpos, true);
		}
		else
		{
			self->UnlinkFromWorld ();
			self->flags |= MF_NOBLOCKMAP;
			// We need to do portal offsetting here explicitly, because SetXY cannot do that.
			newpos -= self->Pos().XY();
			self->SetXY(self->Vec2Offset(newpos.X, newpos.Y));
			self->LinkToWorld ();
		}
		self->WeaveIndexXY = weaveXY;
	}
	if (zdist != 0 && zspeed != 0)
	{
		self->AddZ(-BobSin(weaveZ) * zdist);
		weaveZ = (weaveZ + zspeed) & 63;
		self->AddZ(BobSin(weaveZ) * zdist);
		self->WeaveIndexZ = weaveZ;
	}
}